

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Problem.cpp
# Opt level: O2

int __thiscall Problem::getStateConflicts(Problem *this,vector<int,_std::allocator<int>_> *bidNos)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  vector<node,_std::allocator<node>_> *pvVar4;
  pointer pnVar5;
  int i;
  long lVar6;
  int iVar7;
  ulong uVar8;
  vector<int,_std::allocator<int>_> conflictArray;
  allocator_type local_35;
  value_type_conflict local_34;
  _Vector_base<int,_std::allocator<int>_> local_30;
  
  local_34 = 0;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_30,(long)this->numRegions,&local_34,
             &local_35);
  pvVar4 = this->problemData;
  iVar7 = 0;
  for (lVar6 = 0; lVar6 < this->numCompanies; lVar6 = lVar6 + 1) {
    iVar1 = (bidNos->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_start[lVar6];
    pnVar5 = pvVar4[lVar6].super__Vector_base<node,_std::allocator<node>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = pnVar5[iVar1].norc;
    if ((int)uVar2 < 1) {
      uVar2 = 0;
    }
    for (uVar8 = 0; uVar2 != uVar8; uVar8 = uVar8 + 1) {
      iVar3 = pnVar5[iVar1].region[uVar8];
      if (local_30._M_impl.super__Vector_impl_data._M_start[iVar3] == 0) {
        local_30._M_impl.super__Vector_impl_data._M_start[iVar3] = 1;
      }
      else {
        iVar7 = iVar7 + 1;
      }
    }
  }
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_30);
  return iVar7;
}

Assistant:

int Problem::getStateConflicts(vector<int> bidNos) {
    vector<int> conflictArray(this->numRegions, 0);
    int totalConflicts = 0;
    for (int i = 0; i < this->numCompanies; i++) {
        int curBidNumber = bidNos[i];
        // cout<<"Current bid no.: "<<curBidNumber<<endl;
        int *curRegions = this->problemData[i][curBidNumber].region;
        int curRegionsSize = this->problemData[i][curBidNumber].norc;
        // cout<<"Region size: "<<curRegionsSize<<endl;
        for (int j = 0; j < curRegionsSize; j++) {
            if (conflictArray[curRegions[j]] != 0) {
                totalConflicts++;
            }
            else {
                conflictArray[curRegions[j]] = 1;
            }
        }
    }
    // cout<<"Conflicts found: "<<totalConflicts<<endl;
    return totalConflicts;
}